

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

void __thiscall CVmObjDate::CVmObjDate(CVmObjDate *this,int32_t dayno,uint32_t daytime)

{
  int iVar1;
  undefined4 extraout_var;
  int32_t *piVar2;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003644e0;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,this);
  piVar2 = (int32_t *)CONCAT44(extraout_var,iVar1);
  (this->super_CVmObject).ext_ = (char *)piVar2;
  *piVar2 = dayno;
  piVar2[1] = daytime;
  return;
}

Assistant:

CVmObjDate::CVmObjDate(VMG_ int32_t dayno, uint32_t daytime)
{
    /* allocate our extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* fill it in */
    ext->dayno = dayno;
    ext->daytime = daytime;
}